

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall iu_AssertionTest_x_iutest_x_LE_Test::Body(iu_AssertionTest_x_iutest_x_LE_Test *this)

{
  float f1;
  float f0;
  AssertionResult iutest_ar;
  double d1;
  double d0;
  
  return;
}

Assistant:

IUTEST(AssertionTest, LE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_LE(x0, y0);
    IUTEST_EXPECT_LE(f0, f1);
    IUTEST_INFORM_LE(0.0, 0x1);
    IUTEST_EXPECT_LE(d0, d1);
}